

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ReserveResourceSignatures
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  PSO_CREATE_INTERNAL_FLAGS PVar1;
  Char *pCVar2;
  PipelineResourceSignatureDesc *pPVar3;
  uint *puVar4;
  char (*in_RCX) [86];
  char (*in_R8) [82];
  char (*in_stack_fffffffffffffea8) [78];
  undefined1 local_118 [8];
  string msg_5;
  string msg_4;
  char local_d0 [4];
  uint local_cc;
  undefined1 local_c8 [8];
  string msg_3;
  undefined1 local_a0 [4];
  Uint32 Index;
  string msg_2;
  PipelineResourceSignatureImplType *pSignature;
  Uint32 i;
  Uint32 MaxSignatureBindingIndex;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  FixedLinearAllocator *MemPool_local;
  PipelineStateCreateInfo *CreateInfo_local;
  PipelineStateBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = MemPool;
  if ((this->m_UsingImplicitSignature & 1U) != 0) {
    PVar1 = GetInternalCreateFlags(CreateInfo);
    PVar1 = Diligent::operator&(PVar1,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
    if (PVar1 == PSO_CREATE_INTERNAL_FLAG_NONE) {
      if ((CreateInfo->ResourceSignaturesCount != 0) &&
         (CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0)) {
        FormatString<char[26],char[86]>
                  ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr"
                   ,in_RCX);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"ReserveResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4db);
        std::__cxx11::string::~string((string *)local_40);
      }
      this->m_SignatureCount = '\x01';
      goto LAB_00449803;
    }
  }
  if ((CreateInfo->ResourceSignaturesCount == 0) ||
     (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
    FormatString<char[26],char[85]>
              ((string *)&i,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr"
               ,(char (*) [85])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ReserveResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x4e0);
    std::__cxx11::string::~string((string *)&i);
  }
  pSignature._4_4_ = 0;
  for (pSignature._0_4_ = 0; (uint)pSignature < CreateInfo->ResourceSignaturesCount;
      pSignature._0_4_ = (uint)pSignature + 1) {
    msg_2.field_2._8_8_ =
         ClassPtrCast<Diligent::PipelineResourceSignatureGLImpl,Diligent::IPipelineResourceSignature>
                   (CreateInfo->ppResourceSignatures[(uint)pSignature]);
    if ((PipelineResourceSignatureGLImpl *)msg_2.field_2._8_8_ ==
        (PipelineResourceSignatureGLImpl *)0x0) {
      FormatString<char[38],unsigned_int,char[82]>
                ((string *)local_a0,(Diligent *)"Pipeline resource signature at index ",
                 (char (*) [38])&pSignature,
                 (uint *)
                 " is null. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                 ,in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4e5);
      std::__cxx11::string::~string((string *)local_a0);
    }
    pPVar3 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)msg_2.field_2._8_8_);
    msg_3.field_2._12_4_ = ZEXT14(pPVar3->BindingIndex);
    if (7 < (uint)msg_3.field_2._12_4_) {
      local_d0[0] = '\a';
      local_d0[1] = '\0';
      local_d0[2] = '\0';
      local_d0[3] = '\0';
      in_R8 = (char (*) [82])local_d0;
      local_cc = msg_3.field_2._12_4_;
      FormatString<char[53],unsigned_int,char[26],unsigned_int,char[78]>
                ((string *)local_c8,
                 (Diligent *)"Pipeline resource signature specifies binding index ",
                 (char (*) [53])&local_cc,(uint *)" that exceeds the limit (",(char (*) [26])in_R8,
                 (uint *)
                 "). This error should\'ve been caught by ValidatePipelineResourceSignatureDesc.",
                 in_stack_fffffffffffffea8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4ea);
      std::__cxx11::string::~string((string *)local_c8);
    }
    msg_4.field_2._12_4_ = msg_3.field_2._12_4_;
    puVar4 = std::max<unsigned_int>
                       ((uint *)((long)&pSignature + 4),(uint *)(msg_4.field_2._M_local_buf + 0xc));
    pSignature._4_4_ = *puVar4;
  }
  if (7 < pSignature._4_4_) {
    FormatString<char[26],char[51]>
              ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES",
               (char (*) [51])CreateInfo);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ReserveResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x4ee);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  this->m_SignatureCount = (char)pSignature._4_4_ + '\x01';
  if ((uint)this->m_SignatureCount != pSignature._4_4_ + 1) {
    FormatString<char[26],char[49]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SignatureCount == MaxSignatureBindingIndex + 1",
               (char (*) [49])(ulong)(pSignature._4_4_ + 1));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ReserveResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x4f0);
    std::__cxx11::string::~string((string *)local_118);
  }
LAB_00449803:
  FixedLinearAllocator::AddSpace<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>>
            ((FixedLinearAllocator *)msg.field_2._8_8_,(ulong)this->m_SignatureCount);
  return;
}

Assistant:

void ReserveResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        if (m_UsingImplicitSignature && (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr);
            m_SignatureCount = 1;
        }
        else
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr);
            Uint32 MaxSignatureBindingIndex = 0;
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                const PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY(pSignature != nullptr, "Pipeline resource signature at index ", i, " is null. This error should've been caught by ValidatePipelineResourceSignatures.");

                Uint32 Index = pSignature->GetDesc().BindingIndex;
                VERIFY(Index < MAX_RESOURCE_SIGNATURES,
                       "Pipeline resource signature specifies binding index ", Uint32{Index}, " that exceeds the limit (", MAX_RESOURCE_SIGNATURES - 1,
                       "). This error should've been caught by ValidatePipelineResourceSignatureDesc.");

                MaxSignatureBindingIndex = std::max(MaxSignatureBindingIndex, Uint32{Index});
            }
            VERIFY_EXPR(MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES);
            m_SignatureCount = static_cast<decltype(m_SignatureCount)>(MaxSignatureBindingIndex + 1);
            VERIFY_EXPR(m_SignatureCount == MaxSignatureBindingIndex + 1);
        }

        MemPool.AddSpace<SignatureAutoPtrType>(m_SignatureCount);
    }